

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QCursor>::copyAppend
          (QGenericArrayOps<QCursor> *this,QCursor *b,QCursor *e)

{
  QCursor *this_00;
  ulong in_RDX;
  ulong in_RSI;
  QCursor *in_RDI;
  QCursor *data;
  ulong local_10;
  
  if (in_RSI != in_RDX) {
    this_00 = QArrayDataPointer<QCursor>::begin((QArrayDataPointer<QCursor> *)0x389937);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      QCursor::QCursor(this_00,in_RDI);
      local_10 = local_10 + 8;
      in_RDI[2].d = (QCursorData *)
                    ((long)&((in_RDI[2].d)->ref).super_QAtomicInteger<int>.
                            super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i +
                    1);
    }
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }